

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

bool __thiscall Clasp::Model::isDef(Model *this,Literal p)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = (this->values->ebo_).buf[p.rep_ >> 2];
  if ((bVar1 & 2U - ((p.rep_ & 2) == 0)) != 0) {
    bVar2 = true;
    if ((*(uint *)&this->field_0x20 & 0x8020000) == 0x20000) {
      bVar2 = (bVar1 >> ((byte)(p.rep_ >> 1) & 1) & 4) == 0;
    }
    return bVar2;
  }
  return false;
}

Assistant:

Var var() const { return rep_ >> sign_bit; }